

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

string * __thiscall
XmlRpc::XmlRpcValue::doubleToXml_abi_cxx11_(string *__return_storage_ptr__,XmlRpcValue *this)

{
  stringstream ss;
  locale alStack_1c8 [8];
  long *local_1c0;
  long local_1b0 [2];
  long local_1a0;
  undefined8 auStack_198 [15];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::locale::classic();
  std::ios::imbue(alStack_1c8);
  std::locale::~locale(alStack_1c8);
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a0 + -0x18)) = 0x11;
  std::ostream::_M_insert<double>((this->_value).asDouble);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<value>","");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlRpcValue::doubleToXml() const
  {
    // ticket #2438
    std::stringstream ss;
    ss.imbue(std::locale::classic()); // ensure we're using "C" locale for formatting floating-point (1.4 vs. 1,4, etc.)
    ss.precision(17);
    ss << _value.asDouble;

    std::string xml = VALUE_TAG;
    xml += DOUBLE_TAG;
    xml += ss.str();
    xml += DOUBLE_ETAG;
    xml += VALUE_ETAG;
    return xml;
  }